

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MacAlgorithm.cpp
# Opt level: O0

bool __thiscall MacAlgorithm::verifyInit(MacAlgorithm *this,SymmetricKey *key)

{
  SymmetricKey *key_local;
  MacAlgorithm *this_local;
  bool local_1;
  
  if ((key == (SymmetricKey *)0x0) || (this->currentOperation != NONE)) {
    local_1 = false;
  }
  else {
    this->currentOperation = VERIFY;
    this->currentKey = key;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool MacAlgorithm::verifyInit(const SymmetricKey* key)
{
	if ((key == NULL) || (currentOperation != NONE))
	{
		return false;
	}

	currentOperation = VERIFY;
	currentKey = key;

	return true;
}